

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O2

err_t btokCVCCheck2(btok_cvc_t *cvc,btok_cvc_t *cvca)

{
  err_t eVar1;
  bool_t bVar2;
  int iVar3;
  
  eVar1 = btokCVCCheck(cvc);
  if (eVar1 == 0) {
    bVar2 = memIsValid(cvca,0x128);
    if (bVar2 == 0) {
      eVar1 = 0x6d;
    }
    else {
      iVar3 = strCmp(cvc->authority,cvca->holder);
      eVar1 = 0x135;
      if (iVar3 == 0) {
        bVar2 = tmDateIsValid2(cvca->from);
        eVar1 = 0x134;
        if (bVar2 != 0) {
          bVar2 = tmDateIsValid2(cvca->until);
          if (bVar2 != 0) {
            bVar2 = tmDateLeq2(cvca->from,cvc->from);
            if (bVar2 != 0) {
              bVar2 = tmDateLeq2(cvc->from,cvca->until);
              eVar1 = 0x134;
              if (bVar2 != 0) {
                eVar1 = 0;
              }
            }
          }
        }
      }
    }
  }
  return eVar1;
}

Assistant:

err_t btokCVCCheck2(const btok_cvc_t* cvc, const btok_cvc_t* cvca)
{
	err_t code = btokCVCCheck(cvc);
	ERR_CALL_CHECK(code);
	if (!memIsValid(cvca, sizeof(btok_cvc_t)))
		return ERR_BAD_INPUT;
	if (!strEq(cvc->authority, cvca->holder))
		return ERR_BAD_NAME;
	if (!tmDateIsValid2(cvca->from) ||
		!tmDateIsValid2(cvca->until) ||
		!tmDateLeq2(cvca->from, cvc->from) ||
		!tmDateLeq2(cvc->from, cvca->until))
		return ERR_BAD_DATE;
	return ERR_OK;
}